

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O0

void tchecker::add_accesses(typed_expression_t *expr,process_id_t pid,variable_access_map_t *map)

{
  __node_base_ptr *pp_Var1;
  bool bVar2;
  reference puVar3;
  _Node_iterator_base<unsigned_int,_false> _Stack_d8;
  intvar_id_t intvar_id;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range1_1;
  _Node_iterator_base<unsigned_int,_false> _Stack_b8;
  clock_id_t clock_id;
  iterator __end1;
  iterator __begin1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range1;
  undefined1 local_90 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  intvar_ids;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  clock_ids;
  variable_access_map_t *map_local;
  process_id_t pid_local;
  typed_expression_t *expr_local;
  
  pp_Var1 = &intvar_ids._M_h._M_single_bucket;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)pp_Var1);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_90);
  extract_variables(expr,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)pp_Var1,
                    (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_90);
  pp_Var1 = &intvar_ids._M_h._M_single_bucket;
  __end1 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)pp_Var1);
  _Stack_b8._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)pp_Var1);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xffffffffffffff48);
    if (!bVar2) break;
    puVar3 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end1);
    variable_access_map_t::add(map,*puVar3,VTYPE_CLOCK,VACCESS_READ,pid);
    std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end1);
  }
  __end1_1 = std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)local_90);
  _Stack_d8._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)local_90);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1_1.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xffffffffffffff28);
    if (!bVar2) break;
    puVar3 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end1_1);
    variable_access_map_t::add(map,*puVar3,VTYPE_INTVAR,VACCESS_READ,pid);
    std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end1_1);
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)local_90);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&intvar_ids._M_h._M_single_bucket);
  return;
}

Assistant:

static void add_accesses(tchecker::typed_expression_t const & expr, tchecker::process_id_t pid,
                         tchecker::variable_access_map_t & map)
{
  std::unordered_set<tchecker::clock_id_t> clock_ids;
  std::unordered_set<tchecker::intvar_id_t> intvar_ids;

  tchecker::extract_variables(expr, clock_ids, intvar_ids);

  for (tchecker::clock_id_t clock_id : clock_ids)
    map.add(clock_id, tchecker::VTYPE_CLOCK, tchecker::VACCESS_READ, pid);
  for (tchecker::intvar_id_t intvar_id : intvar_ids)
    map.add(intvar_id, tchecker::VTYPE_INTVAR, tchecker::VACCESS_READ, pid);
}